

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O0

StringEnum * parseLocationOrError(QString *locationString)

{
  bool bVar1;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  StringEnum *se;
  StringEnum *__end1;
  StringEnum *__begin1;
  StringEnum (*__range1) [23];
  char16_t *str;
  QString message;
  DataPointer *in_stack_ffffffffffffff38;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff40;
  QString *in_stack_ffffffffffffff48;
  QLatin1String *in_stack_ffffffffffffff50;
  StringEnum *in_stack_ffffffffffffff58;
  pointer_____offset_0x10___ *this;
  StringEnum *local_98;
  QChar fillChar;
  QChar local_62 [13];
  QArrayDataPointer<char16_t> local_48;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = lookupTableData;
  this = &void(QList<std::pair<QString,QString>>const&)::typeinfo;
  while( true ) {
    if (local_98 == (StringEnum *)this) {
      local_30 = 0xaaaaaaaaaaaaaaaa;
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      fillChar.ucs = L'\0';
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_48,(Data *)0x0,L"Unknown location: %1",0x14);
      QString::QString((QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff40);
      QChar::QChar<char16_t,_true>(local_62,L' ');
      QString::arg<QString,_true>
                ((QString *)this,(QString *)in_stack_ffffffffffffff58,
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),fillChar);
      error((QString *)in_stack_ffffffffffffff50);
    }
    in_stack_ffffffffffffff50 = in_RDI;
    in_stack_ffffffffffffff58 = local_98;
    QLatin1String::QLatin1String(in_RDI,(char *)in_stack_ffffffffffffff48);
    bVar1 = operator==(in_stack_ffffffffffffff48,(QLatin1StringView *)in_stack_ffffffffffffff40);
    if (bVar1) break;
    local_98 = local_98 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_stack_ffffffffffffff58;
  }
  __stack_chk_fail();
}

Assistant:

static const StringEnum &parseLocationOrError(const QString &locationString)
{
    for (const StringEnum &se : lookupTableData)
        if (locationString == QLatin1StringView(se.stringvalue))
            return se;

    QString message = QStringLiteral("Unknown location: %1");
    error(message.arg(locationString));
}